

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReGlob.hpp
# Opt level: O0

void __thiscall SudoMaker::ReGlob::reglob_error::reglob_error(reglob_error *this,string *str)

{
  string *str_local;
  reglob_error *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__reglob_error_0014fb88;
  std::__cxx11::string::string((string *)&this->str_);
  std::__cxx11::string::operator=((string *)&this->str_,(string *)str);
  return;
}

Assistant:

reglob_error(std::string str) {
			str_ = std::move(str);
		}